

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-client.c
# Opt level: O1

int lws_client_create_tls(lws *wsi,char **pcce,int do_c1)

{
  lws_context *plVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  lws_ssl_capable_status lVar5;
  int iVar6;
  lws_usec_t lVar7;
  char *pcVar8;
  lws *plVar9;
  lws_ssl_capable_status lVar10;
  lws_vhost *plVar11;
  ulong uVar12;
  char cVar13;
  
  if (((wsi->tls).use_ssl & 1) == 0) {
    (wsi->tls).ssl = (lws_tls_conn *)0x0;
    return 0;
  }
  if ((wsi->tls).ssl == (lws_tls_conn *)0x0) {
    if ((wsi->field_0x474 & 0x20) == 0) {
      iVar6 = lws_tls_restrict_borrow((wsi->a).context);
      if (iVar6 == 0) {
        wsi->field_0x474 = wsi->field_0x474 | 1;
        plVar1 = (wsi->a).context;
        if (plVar1->ssl_handshake_serialize != 0) {
          for (plVar11 = plVar1->vhost_list; plVar11 != (lws_vhost *)0x0;
              plVar11 = plVar11->vhost_next) {
            if (plVar1->pt[0].fds_count != 0) {
              uVar12 = 0;
              do {
                plVar9 = wsi_from_fd(plVar1,plVar1->pt[0].fds[uVar12].fd);
                cVar13 = '\x06';
                if ((((plVar9 != (lws *)0x0) && (plVar9->tsi == '\0')) && (plVar9 != wsi)) &&
                   ((plVar9->a).vhost == plVar11)) {
                  cVar13 = (short)plVar9->wsistate != 0x20;
                }
                if ((cVar13 != '\x06') && (cVar13 != '\0')) {
                  lws_tls_restrict_return((wsi->a).context);
                  wsi->field_0x474 = wsi->field_0x474 & 0xfe;
                  pcVar8 = "ssl handshake serialization";
                  goto LAB_00132c3c;
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 < plVar1->pt[0].fds_count);
            }
          }
        }
        goto LAB_00132c0c;
      }
      pcVar8 = "tls restriction limit";
    }
    else {
LAB_00132c0c:
      iVar6 = lws_ssl_client_bio_create(wsi);
      if (-1 < iVar6) goto LAB_00132a54;
      pcVar8 = "bio_create failed";
    }
LAB_00132c3c:
    *pcce = pcVar8;
    iVar6 = -1;
  }
  else {
LAB_00132a54:
    if (do_c1 != 0) {
      lVar7 = lws_now_usecs();
      wsi->conmon_datum = lVar7;
      plVar1 = (wsi->a).context;
      lVar5 = lws_tls_client_connect
                        (wsi,(char *)plVar1->pt[wsi->tsi].serv_buf,(ulong)plVar1->pt_serv_buf_size);
      lVar10 = LWS_SSL_CAPABLE_DONE;
      switch(lVar5) {
      case LWS_SSL_CAPABLE_DONE:
        lVar7 = lws_now_usecs();
        (wsi->conmon).ciu_tls = (int)lVar7 - (int)wsi->conmon_datum;
        lVar10 = ~LWS_SSL_CAPABLE_MORE_SERVICE_READ;
        bVar2 = false;
        break;
      case LWS_SSL_CAPABLE_MORE_SERVICE_WRITE:
        lws_callback_on_writable(wsi);
      case LWS_SSL_CAPABLE_MORE_SERVICE:
      case LWS_SSL_CAPABLE_MORE_SERVICE_READ:
        lwsi_set_state(wsi,0x204);
      default:
        bVar2 = true;
        break;
      case LWS_SSL_CAPABLE_ERROR:
        bVar3 = true;
        bVar2 = false;
        goto LAB_00132b13;
      }
      bVar3 = false;
      lVar5 = lVar10;
LAB_00132b13:
      bVar4 = false;
      _lws_log(0x10,"%s: lws_ssl_client_connect1: %d\n","lws_client_create_tls",(ulong)(uint)lVar5);
      iVar6 = 1;
      if (bVar2) goto LAB_00132c47;
      if (!bVar3) {
        iVar6 = lws_tls_server_conn_alpn(wsi);
        bVar4 = true;
        goto LAB_00132c47;
      }
      pcVar8 = (char *)((wsi->a).context)->pt[wsi->tsi].serv_buf;
      goto LAB_00132c3c;
    }
    iVar6 = 0;
  }
  bVar4 = false;
LAB_00132c47:
  if (bVar4) {
    return 0;
  }
  return iVar6;
}

Assistant:

int
lws_client_create_tls(struct lws *wsi, const char **pcce, int do_c1)
{
	/* we can retry this... just cook the SSL BIO the first time */

	if (wsi->tls.use_ssl & LCCSCF_USE_SSL) {
		int n;

		if (!wsi->tls.ssl) {

#if defined(LWS_WITH_TLS)
			if (!wsi->transaction_from_pipeline_queue) {
				if (lws_tls_restrict_borrow(wsi->a.context)) {
					*pcce = "tls restriction limit";
					return CCTLS_RETURN_ERROR;
				}
				wsi->tls_borrowed = 1;
				if (wsi->a.context->ssl_handshake_serialize) {
					if (lws_ssl_handshake_serialize(wsi->a.context, wsi)) {
						lws_tls_restrict_return(wsi->a.context);
						wsi->tls_borrowed = 0;
						*pcce = "ssl handshake serialization";
						return CCTLS_RETURN_ERROR;
					}
				}
			}
#endif

			if (lws_ssl_client_bio_create(wsi) < 0) {
				*pcce = "bio_create failed";
				return CCTLS_RETURN_ERROR;
			}
		}

		if (!do_c1)
			return CCTLS_RETURN_DONE;

		lws_metrics_caliper_report(wsi->cal_conn, METRES_GO);
		lws_metrics_caliper_bind(wsi->cal_conn, wsi->a.context->mt_conn_tls);
#if defined(LWS_WITH_CONMON)
		wsi->conmon_datum = lws_now_usecs();
#endif

		n = lws_ssl_client_connect1(wsi, (char *)wsi->a.context->pt[(int)wsi->tsi].serv_buf,
					    wsi->a.context->pt_serv_buf_size);
		lwsl_debug("%s: lws_ssl_client_connect1: %d\n", __func__, n);
		if (!n)
			return CCTLS_RETURN_RETRY; /* caller should return 0 */

		if (n < 0) {
			*pcce = (const char *)wsi->a.context->pt[(int)wsi->tsi].serv_buf;
			lws_metrics_caliper_report(wsi->cal_conn, METRES_NOGO);
			return CCTLS_RETURN_ERROR;
		}
		/* ...connect1 already handled caliper if SSL_accept done */

		lws_tls_server_conn_alpn(wsi);

	} else
		wsi->tls.ssl = NULL;

	return CCTLS_RETURN_DONE; /* OK */
}